

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O1

dgMatrix * __thiscall dgMatrix::Symetric3by3Inverse(dgMatrix *__return_storage_ptr__,dgMatrix *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  
  fVar1 = (this->m_up).super_dgTemplateVector<float>.m_y;
  fVar2 = (this->m_front).super_dgTemplateVector<float>.m_x;
  fVar3 = (this->m_front).super_dgTemplateVector<float>.m_y;
  fVar4 = (this->m_right).super_dgTemplateVector<float>.m_z;
  fVar5 = (this->m_up).super_dgTemplateVector<float>.m_z;
  fVar6 = (this->m_front).super_dgTemplateVector<float>.m_z;
  fVar8 = fVar6 * fVar3 * fVar5;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 + fVar8)),ZEXT416((uint)fVar4),
                           ZEXT416((uint)(fVar2 * fVar1)));
  auVar9 = vfnmadd213ss_fma(ZEXT416((uint)(fVar6 * fVar1)),ZEXT416((uint)fVar6),auVar9);
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  auVar13 = vxorps_avx512vl(ZEXT416((uint)fVar3),auVar13);
  auVar13 = ZEXT416((uint)(fVar3 * auVar13._0_4_));
  auVar9 = vfmadd231ss_fma(auVar9,auVar13,ZEXT416((uint)fVar4));
  auVar9 = vfnmadd213ss_fma(ZEXT416((uint)(fVar5 * fVar2)),ZEXT416((uint)fVar5),auVar9);
  fVar10 = 1.0 / auVar9._0_4_;
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar4))
  ;
  fVar12 = fVar10 * auVar9._0_4_;
  fVar8 = (this->m_right).super_dgTemplateVector<float>.m_x;
  fVar7 = (this->m_up).super_dgTemplateVector<float>.m_x;
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar7)),ZEXT416((uint)fVar8),ZEXT416((uint)fVar5))
  ;
  fVar11 = fVar10 * auVar9._0_4_;
  fVar5 = (this->m_right).super_dgTemplateVector<float>.m_y;
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar1)),ZEXT416((uint)fVar5),ZEXT416((uint)fVar7))
  ;
  fVar7 = fVar10 * auVar9._0_4_;
  if ((((!NAN(fVar7)) && ((uint)ABS(fVar7) < 0x7f800000)) && (!NAN(fVar11))) &&
     (((uint)ABS(fVar12) < 0x7f800000 && ((uint)ABS(fVar11) < 0x7f800000)))) {
    auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar2),
                             ZEXT416((uint)(fVar6 * fVar6)));
    fVar4 = auVar9._0_4_ * fVar10;
    auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar3),
                             ZEXT416((uint)(fVar5 * fVar2)));
    fVar3 = fVar10 * auVar9._0_4_;
    if ((!NAN(fVar3)) && (((uint)ABS(fVar3) < 0x7f800000 && ((uint)ABS(fVar4) < 0x7f800000)))) {
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),auVar13);
      fVar10 = fVar10 * auVar9._0_4_;
      if ((uint)ABS(fVar10) < 0x7f800000) {
        (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_x = fVar12;
        (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_y = fVar11;
        (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_z = fVar7;
        (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_w = 0.0;
        (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_x = fVar11;
        (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_y = fVar4;
        (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_z = fVar3;
        (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_w = 0.0;
        (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_x = fVar7;
        (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_y = fVar3;
        (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_z = fVar10;
        *(undefined1 (*) [16])&(__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_w =
             ZEXT416(0) << 0x20;
        (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_w = 1.0;
        return __return_storage_ptr__;
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

dgMatrix dgMatrix::Symetric3by3Inverse () const
{
	const dgMatrix& mat = *this;
	hacd::HaF64 det = mat[0][0] * mat[1][1] * mat[2][2] + 
			mat[0][1] * mat[1][2] * mat[0][2] * hacd::HaF32 (2.0f) -
			mat[0][2] * mat[1][1] * mat[0][2] -
			mat[0][1] * mat[0][1] * mat[2][2] -
			mat[0][0] * mat[1][2] * mat[1][2];

	det = hacd::HaF32 (1.0f) / det;

	hacd::HaF32 x11 = (hacd::HaF32)(det * (mat[1][1] * mat[2][2] - mat[1][2] * mat[1][2]));  
	hacd::HaF32 x22 = (hacd::HaF32)(det * (mat[0][0] * mat[2][2] - mat[0][2] * mat[0][2]));  
	hacd::HaF32 x33 = (hacd::HaF32)(det * (mat[0][0] * mat[1][1] - mat[0][1] * mat[0][1]));  

	hacd::HaF32 x12 = (hacd::HaF32)(det * (mat[1][2] * mat[2][0] - mat[1][0] * mat[2][2]));  
	hacd::HaF32 x13 = (hacd::HaF32)(det * (mat[1][0] * mat[2][1] - mat[1][1] * mat[2][0]));  
	hacd::HaF32 x23 = (hacd::HaF32)(det * (mat[0][1] * mat[2][0] - mat[0][0] * mat[2][1]));  


#ifdef _DEBUG
	dgMatrix matInv (dgVector (x11, x12, x13, hacd::HaF32(0.0f)),
				     dgVector (x12, x22, x23, hacd::HaF32(0.0f)),
					 dgVector (x13, x23, x33, hacd::HaF32(0.0f)),
					 dgVector (hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(1.0f)));

	dgMatrix test (matInv * mat);
	HACD_ASSERT (dgAbsf (test[0][0] - hacd::HaF32(1.0f)) < hacd::HaF32(0.01f));
	HACD_ASSERT (dgAbsf (test[1][1] - hacd::HaF32(1.0f)) < hacd::HaF32(0.01f));
	HACD_ASSERT (dgAbsf (test[2][2] - hacd::HaF32(1.0f)) < hacd::HaF32(0.01f));
#endif

	return dgMatrix (dgVector (x11, x12, x13, hacd::HaF32(0.0f)),
					 dgVector (x12, x22, x23, hacd::HaF32(0.0f)),
					 dgVector (x13, x23, x33, hacd::HaF32(0.0f)),
					 dgVector (hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(1.0f)));
}